

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void SubtractAndAccumulate_SSE2(__m128i a,__m128i b,__m128i *sum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  ulong local_168;
  ulong uStack_160;
  ulong local_158;
  ulong uStack_150;
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  int local_f8;
  int iStack_f4;
  int iStack_f0;
  int iStack_ec;
  byte local_d8;
  undefined1 uStack_d7;
  undefined1 uStack_d6;
  undefined1 uStack_d5;
  byte bStack_d4;
  undefined1 uStack_d3;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  byte bStack_b0;
  undefined1 uStack_af;
  undefined1 uStack_ae;
  undefined1 uStack_ad;
  byte bStack_ac;
  undefined1 uStack_ab;
  undefined1 uStack_aa;
  undefined1 uStack_a9;
  __m128i sum2;
  __m128i sum1;
  __m128i C1;
  __m128i C0;
  __m128i zero;
  __m128i abs_a_b;
  __m128i b_a;
  __m128i a_b;
  
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = in_XMM1_Qa;
  auVar6 = psubusb(auVar1,auVar6);
  auVar8._8_8_ = in_XMM1_Qb;
  auVar8._0_8_ = in_XMM1_Qa;
  auVar7._8_8_ = in_XMM0_Qb;
  auVar7._0_8_ = in_XMM0_Qa;
  auVar7 = psubusb(auVar8,auVar7);
  local_158 = auVar6._0_8_;
  uStack_150 = auVar6._8_8_;
  local_168 = auVar7._0_8_;
  uStack_160 = auVar7._8_8_;
  local_158 = local_158 | local_168;
  uStack_150 = uStack_150 | uStack_160;
  local_d8 = (byte)local_158;
  uStack_d7 = (undefined1)(local_158 >> 8);
  uStack_d6 = (undefined1)(local_158 >> 0x10);
  uStack_d5 = (undefined1)(local_158 >> 0x18);
  bStack_d4 = (byte)(local_158 >> 0x20);
  uStack_d3 = (undefined1)(local_158 >> 0x28);
  uStack_d2 = (undefined1)(local_158 >> 0x30);
  uStack_d1 = (undefined1)(local_158 >> 0x38);
  bStack_b0 = (byte)uStack_150;
  uStack_af = (undefined1)(uStack_150 >> 8);
  uStack_ae = (undefined1)(uStack_150 >> 0x10);
  uStack_ad = (undefined1)(uStack_150 >> 0x18);
  bStack_ac = (byte)(uStack_150 >> 0x20);
  uStack_ab = (undefined1)(uStack_150 >> 0x28);
  uStack_aa = (undefined1)(uStack_150 >> 0x30);
  uStack_a9 = (undefined1)(uStack_150 >> 0x38);
  auVar5[1] = 0;
  auVar5[0] = local_d8;
  auVar5[2] = uStack_d7;
  auVar5[3] = 0;
  auVar5[4] = uStack_d6;
  auVar5[5] = 0;
  auVar5[6] = uStack_d5;
  auVar5[7] = 0;
  auVar5[9] = 0;
  auVar5[8] = bStack_d4;
  auVar5[10] = uStack_d3;
  auVar5[0xb] = 0;
  auVar5[0xc] = uStack_d2;
  auVar5[0xd] = 0;
  auVar5[0xe] = uStack_d1;
  auVar4[1] = 0;
  auVar4[0] = local_d8;
  auVar4[2] = uStack_d7;
  auVar4[3] = 0;
  auVar4[4] = uStack_d6;
  auVar4[5] = 0;
  auVar4[6] = uStack_d5;
  auVar4[7] = 0;
  auVar4[9] = 0;
  auVar4[8] = bStack_d4;
  auVar4[10] = uStack_d3;
  auVar4[0xb] = 0;
  auVar4[0xc] = uStack_d2;
  auVar4[0xd] = 0;
  auVar4[0xe] = uStack_d1;
  auVar5[0xf] = 0;
  auVar4[0xf] = 0;
  auVar7 = pmaddwd(auVar5,auVar4);
  auVar3[1] = 0;
  auVar3[0] = bStack_b0;
  auVar3[2] = uStack_af;
  auVar3[3] = 0;
  auVar3[4] = uStack_ae;
  auVar3[5] = 0;
  auVar3[6] = uStack_ad;
  auVar3[7] = 0;
  auVar3[9] = 0;
  auVar3[8] = bStack_ac;
  auVar3[10] = uStack_ab;
  auVar3[0xb] = 0;
  auVar3[0xc] = uStack_aa;
  auVar3[0xd] = 0;
  auVar3[0xe] = uStack_a9;
  auVar2[1] = 0;
  auVar2[0] = bStack_b0;
  auVar2[2] = uStack_af;
  auVar2[3] = 0;
  auVar2[4] = uStack_ae;
  auVar2[5] = 0;
  auVar2[6] = uStack_ad;
  auVar2[7] = 0;
  auVar2[9] = 0;
  auVar2[8] = bStack_ac;
  auVar2[10] = uStack_ab;
  auVar2[0xb] = 0;
  auVar2[0xc] = uStack_aa;
  auVar2[0xd] = 0;
  auVar2[0xe] = uStack_a9;
  auVar3[0xf] = 0;
  auVar2[0xf] = 0;
  auVar8 = pmaddwd(auVar3,auVar2);
  local_f8 = auVar7._0_4_;
  iStack_f4 = auVar7._4_4_;
  iStack_f0 = auVar7._8_4_;
  iStack_ec = auVar7._12_4_;
  local_108 = auVar8._0_4_;
  iStack_104 = auVar8._4_4_;
  iStack_100 = auVar8._8_4_;
  iStack_fc = auVar8._12_4_;
  *in_RDI = local_f8 + local_108;
  in_RDI[1] = iStack_f4 + iStack_104;
  in_RDI[2] = iStack_f0 + iStack_100;
  in_RDI[3] = iStack_ec + iStack_fc;
  return;
}

Assistant:

static WEBP_INLINE void SubtractAndAccumulate_SSE2(const __m128i a,
                                                   const __m128i b,
                                                   __m128i* const sum) {
  // take abs(a-b) in 8b
  const __m128i a_b = _mm_subs_epu8(a, b);
  const __m128i b_a = _mm_subs_epu8(b, a);
  const __m128i abs_a_b = _mm_or_si128(a_b, b_a);
  // zero-extend to 16b
  const __m128i zero = _mm_setzero_si128();
  const __m128i C0 = _mm_unpacklo_epi8(abs_a_b, zero);
  const __m128i C1 = _mm_unpackhi_epi8(abs_a_b, zero);
  // multiply with self
  const __m128i sum1 = _mm_madd_epi16(C0, C0);
  const __m128i sum2 = _mm_madd_epi16(C1, C1);
  *sum = _mm_add_epi32(sum1, sum2);
}